

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable ARKodeSPRKTable_Alloc(int stages)

{
  sunrealtype *psVar1;
  int in_EDI;
  ARKodeSPRKTable sprk_table;
  ARKodeSPRKTable local_8;
  
  local_8 = (ARKodeSPRKTable)malloc(0x18);
  if (local_8 == (ARKodeSPRKTable)0x0) {
    local_8 = (ARKodeSPRKTable)0x0;
  }
  else {
    memset(local_8,0,0x18);
    psVar1 = (sunrealtype *)malloc((long)in_EDI << 3);
    local_8->ahat = psVar1;
    if (local_8->ahat == (sunrealtype *)0x0) {
      ARKodeSPRKTable_Free((ARKodeSPRKTable)0x199780);
      local_8 = (ARKodeSPRKTable)0x0;
    }
    else {
      psVar1 = (sunrealtype *)malloc((long)in_EDI << 3);
      local_8->a = psVar1;
      if (local_8->a == (sunrealtype *)0x0) {
        ARKodeSPRKTable_Free((ARKodeSPRKTable)0x1997b8);
        local_8 = (ARKodeSPRKTable)0x0;
      }
      else {
        local_8->stages = in_EDI;
      }
    }
  }
  return local_8;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_Alloc(int stages)
{
  ARKodeSPRKTable sprk_table = NULL;

  sprk_table = (ARKodeSPRKTable)malloc(sizeof(struct ARKodeSPRKTableMem));
  if (!sprk_table) { return NULL; }

  memset(sprk_table, 0, sizeof(struct ARKodeSPRKTableMem));

  sprk_table->ahat = (sunrealtype*)malloc(stages * sizeof(sunrealtype));
  if (!(sprk_table->ahat))
  {
    ARKodeSPRKTable_Free(sprk_table);
    return NULL;
  }

  sprk_table->a = (sunrealtype*)malloc(stages * sizeof(sunrealtype));
  if (!(sprk_table->a))
  {
    ARKodeSPRKTable_Free(sprk_table);
    return NULL;
  }

  sprk_table->stages = stages;

  return sprk_table;
}